

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int make_canonical(ly_ctx *ctx,int type,char **value,void *data1,void *data2)

{
  byte bVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  char *__string;
  uint8_t *puVar5;
  char *__src;
  char *pcVar6;
  long lVar7;
  undefined8 uVar8;
  char cVar9;
  char *pcVar10;
  int iVar11;
  
  __string = ly_buf();
  puVar5 = ly_buf_used_location();
  if ((*puVar5 == '\0') || (*__string == '\0')) {
    __src = (char *)0x0;
  }
  else {
    __src = strndup(__string,0x3ff);
  }
  puVar5 = ly_buf_used_location();
  *puVar5 = *puVar5 + '\x01';
  switch(type) {
  case 2:
    iVar4 = *data2;
    *__string = '\0';
    if (0 < (long)iVar4) {
      lVar7 = 0;
      do {
        puVar2 = *(undefined8 **)((long)data1 + lVar7 * 8);
        if (puVar2 != (undefined8 *)0x0) {
          if (*__string == '\0') {
            strcpy(__string,(char *)*puVar2);
          }
          else {
            pcVar10 = strdup(__string);
            sprintf(__string,"%s %s",pcVar10,*puVar2);
            free(pcVar10);
          }
        }
        lVar7 = lVar7 + 1;
      } while (iVar4 != lVar7);
    }
    break;
  default:
    goto switchD_00125433_caseD_3;
  case 4:
    lVar7 = *data1;
    if (lVar7 == 0) {
      builtin_strncpy(__string,"0.0",4);
    }
    else {
      bVar1 = *data2;
      iVar4 = sprintf(__string,"%ld ",lVar7);
      if (iVar4 + -1 <= (int)(uint)bVar1) {
        iVar4 = sprintf(__string,"0%0*ld ",(ulong)(uint)bVar1,lVar7);
      }
      if (bVar1 != 0) {
        lVar7 = (long)iVar4;
        iVar4 = iVar4 - (uint)bVar1;
        iVar11 = bVar1 + 1;
        bVar3 = true;
        pcVar10 = __string + lVar7;
        do {
          if ((iVar11 == 2 || !bVar3) || (pcVar10[-2] != '0')) {
            cVar9 = pcVar10[-2];
            bVar3 = false;
          }
          else {
            bVar3 = true;
            cVar9 = '\0';
          }
          pcVar10[-1] = cVar9;
          iVar11 = iVar11 + -1;
          pcVar10 = pcVar10 + -1;
        } while (1 < iVar11);
      }
      __string[(long)iVar4 + -1] = '.';
    }
    break;
  case 7:
    pcVar10 = *value;
    pcVar6 = strchr(pcVar10,0x3a);
    if (pcVar6 == (char *)0x0) {
      sprintf(__string,"%s:%s",data1,pcVar10);
    }
    else {
      strcpy(__string,pcVar10);
    }
    break;
  case 0xc:
  case 0xe:
  case 0x10:
  case 0x12:
    uVar8 = *data1;
    pcVar10 = "%ld";
    goto LAB_00125453;
  case 0xd:
  case 0xf:
  case 0x11:
  case 0x13:
    uVar8 = *data1;
    pcVar10 = "%lu";
LAB_00125453:
    sprintf(__string,pcVar10,uVar8);
  }
  pcVar10 = *value;
  iVar4 = strcmp(__string,pcVar10);
  if (iVar4 != 0) {
    lydict_remove(ctx,pcVar10);
    pcVar10 = lydict_insert(ctx,__string,0);
    *value = pcVar10;
  }
switchD_00125433_caseD_3:
  if (__src != (char *)0x0) {
    strcpy(__string,__src);
    free(__src);
  }
  puVar5 = ly_buf_used_location();
  *puVar5 = *puVar5 + 0xff;
  return (int)puVar5;
}

Assistant:

static int
make_canonical(struct ly_ctx *ctx, int type, const char **value, void *data1, void *data2)
{
    char *buf = ly_buf(), *buf_backup = NULL, *str;
    struct lys_type_bit **bits = NULL;
    const char *module_name;
    int i, j, count, ret = 0;
    int64_t num;
    uint64_t unum;
    uint8_t c;

    /* prepare buffer for creating canonical representation */
    if (ly_buf_used && buf[0]) {
        buf_backup = strndup(buf, LY_BUF_SIZE - 1);
    }
    ly_buf_used++;

    switch (type) {
    case LY_TYPE_BITS:
        bits = (struct lys_type_bit **)data1;
        count = *((int *)data2);
        /* in canonical form, the bits are ordered by their position */
        buf[0] = '\0';
        for (i = 0; i < count; i++) {
            if (!bits[i]) {
                /* bit not set */
                continue;
            }
            if (buf[0]) {
                str = strdup(buf);
                sprintf(buf, "%s %s", str, bits[i]->name);
                free(str);
            } else {
                sprintf(buf, "%s", bits[i]->name);
            }
        }
        break;

    case LY_TYPE_IDENT:
        module_name = (const char *)data1;
        /* identity must always have a prefix */
        if (!strchr(*value, ':')) {
            sprintf(buf, "%s:%s", module_name, *value);
        } else {
            strcpy(buf, *value);
        }
        break;

    case LY_TYPE_DEC64:
        num = *((int64_t *)data1);
        c = *((uint8_t *)data2);
        if (num) {
            count = sprintf(buf, "%"PRId64" ", num);
            if ((count - 1) <= c) {
                /* we have 0. value, print the value with the leading zeros
                 * (one for 0. and also keep the correct with of num according
                 * to fraction-digits value) */
                count = sprintf(buf, "0%0*"PRId64" ", c, num);
            }
            for (i = c, j = 1; i > 0 ; i--) {
                if (j && i > 1 && buf[count - 2] == '0') {
                    /* we have trailing zero to skip */
                    buf[count - 1] = '\0';
                } else {
                    j = 0;
                    buf[count - 1] = buf[count - 2];
                }
                count--;
            }
            buf[count - 1] = '.';
        } else {
            /* zero */
            sprintf(buf, "0.0");
        }
        break;

    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
        num = *((int64_t *)data1);
        sprintf(buf, "%"PRId64, num);
        break;

    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        unum = *((uint64_t *)data1);
        sprintf(buf, "%"PRIu64, unum);
        break;

    default:
        /* should not be even called - just do nothing */
        goto cleanup;
    }

    if (strcmp(buf, *value)) {
        lydict_remove(ctx, *value);
        *value = lydict_insert(ctx, buf, 0);
        ret = 1;
    }

cleanup:
    if (buf_backup) {
        /* return previous internal buffer content */
        strcpy(buf, buf_backup);
        free(buf_backup);
    }
    ly_buf_used--;

    return ret;
}